

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O0

int __thiscall
QUnixPageSetupDialogPrivate::init(QUnixPageSetupDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  OutputFormat outputFormat;
  QFlags<QDialogButtonBox::StandardButton> QVar1;
  QWidget *pQVar2;
  QPageSetupWidget *pQVar3;
  QDialogButtonBox *this_00;
  QVBoxLayout *this_01;
  long in_FS_OFFSET;
  QVBoxLayout *lay;
  QDialogButtonBox *buttons;
  QPageSetupDialog *q;
  QWidget *in_stack_000000a0;
  QPageSetupWidget *in_stack_000000a8;
  QPrinter *printerName;
  undefined4 in_stack_ffffffffffffff40;
  QPrintDevice *printDevice;
  QPrinter *in_stack_ffffffffffffff50;
  QPageSetupWidget *in_stack_ffffffffffffff58;
  QObject *this_02;
  QObject local_30 [8];
  QObject local_28 [8];
  QPrintDevice local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QWidget *)q_func(this);
  pQVar3 = (QPageSetupWidget *)operator_new(0x1f8);
  QPageSetupWidget::QPageSetupWidget(in_stack_000000a8,in_stack_000000a0);
  this->widget = pQVar3;
  printerName = (this->super_QPageSetupDialogPrivate).printer;
  pQVar3 = this->widget;
  outputFormat = QPrinter::outputFormat((QPrinter *)pQVar3);
  printDevice = &local_20;
  QPrinter::printerName((QPrinter *)CONCAT44(outputFormat,in_stack_ffffffffffffff40));
  QPageSetupWidget::setPrinter
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,printDevice,outputFormat,
             (QString *)printerName);
  QString::~QString((QString *)0x162627);
  this_00 = (QDialogButtonBox *)operator_new(0x28);
  QVar1 = operator|((enum_type)((ulong)pQVar3 >> 0x20),(enum_type)pQVar3);
  QDialogButtonBox::QDialogButtonBox
            (this_00,(QFlags_conflict *)
                     (ulong)(uint)QVar1.
                                  super_QFlagsStorageHelper<QDialogButtonBox::StandardButton,_4>.
                                  super_QFlagsStorage<QDialogButtonBox::StandardButton>.i,Horizontal
             ,pQVar2);
  this_02 = local_28;
  QObject::connect(this_02,(char *)this_00,(QObject *)"2accepted()",(char *)pQVar2,0x18cf14);
  QMetaObject::Connection::~Connection((Connection *)this_02);
  QObject::connect(local_30,(char *)this_00,(QObject *)"2rejected()",(char *)pQVar2,0x18cf2a);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01,pQVar2);
  pQVar3 = this->widget;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x162751);
  QBoxLayout::addWidget((QWidget *)this_01,(int)pQVar3,(QFlags_conflict *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x16279a);
  QBoxLayout::addWidget((QWidget *)this_01,(int)this_00,(QFlags_conflict *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QUnixPageSetupDialogPrivate::init()
{
    Q_Q(QPageSetupDialog);

    widget = new QPageSetupWidget(q);
    widget->setPrinter(printer, nullptr, printer->outputFormat(), printer->printerName());

    QDialogButtonBox *buttons = new QDialogButtonBox(QDialogButtonBox::Ok
                                                     | QDialogButtonBox::Cancel,
                                                     Qt::Horizontal, q);
    QObject::connect(buttons, SIGNAL(accepted()), q, SLOT(accept()));
    QObject::connect(buttons, SIGNAL(rejected()), q, SLOT(reject()));

    QVBoxLayout *lay = new QVBoxLayout(q);
    lay->addWidget(widget);
    lay->addWidget(buttons);
}